

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

string * __thiscall Ratio::toString_abi_cxx11_(Ratio *this)

{
  bool bVar1;
  ostream *poVar2;
  long in_RSI;
  string *in_RDI;
  double dVar3;
  PhyloTreeEdge *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  PhyloTreeEdge *e;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  ostringstream ss;
  Ratio *in_stack_fffffffffffffd98;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  *in_stack_fffffffffffffda0;
  string local_218 [32];
  reference local_1f8;
  PhyloTreeEdge *local_1f0;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_1e8;
  long local_1e0;
  string local_1c8 [32];
  reference local_1a8;
  PhyloTreeEdge *local_1a0;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_198;
  long local_190;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_190 = in_RSI + 0x10;
  local_198._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffd98
                 );
  local_1a0 = (PhyloTreeEdge *)
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                         in_stack_fffffffffffffd98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffda0,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffd98);
    if (!bVar1) break;
    local_1a8 = __gnu_cxx::
                __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                ::operator*(&local_198);
    (**(local_1a8->super_Bipartition)._vptr_Bipartition)(local_1c8);
    poVar2 = std::operator<<((ostream *)local_188,local_1c8);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string(local_1c8);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_198);
  }
  dVar3 = getELength(in_stack_fffffffffffffd98);
  poVar2 = (ostream *)std::ostream::operator<<(local_188,dVar3);
  poVar2 = std::operator<<(poVar2," / ");
  dVar3 = getFLength(in_stack_fffffffffffffd98);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
  std::operator<<(poVar2," ");
  local_1e0 = in_RSI + 0x28;
  local_1e8._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffd98
                 );
  local_1f0 = (PhyloTreeEdge *)
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                         in_stack_fffffffffffffd98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)poVar2,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffd98);
    if (!bVar1) break;
    local_1f8 = __gnu_cxx::
                __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                ::operator*(&local_1e8);
    (**(local_1f8->super_Bipartition)._vptr_Bipartition)(local_218);
    in_stack_fffffffffffffd98 = (Ratio *)std::operator<<((ostream *)local_188,local_218);
    std::operator<<((ostream *)in_stack_fffffffffffffd98," ");
    std::__cxx11::string::~string(local_218);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_1e8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

string Ratio::toString() {
    std::ostringstream ss;
    for (auto &e : eEdges) {
        ss << e.toString() << " ";
    }
    ss << getELength() << " / " << getFLength() << " ";
    for (auto &f : fEdges) {
        ss << f.toString() << " ";
    }

    return ss.str();
}